

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int getBiomeAt(Generator *g,int scale,int x,int y,int z)

{
  Range r_00;
  int iVar1;
  int *__ptr;
  undefined4 in_EDX;
  int in_ESI;
  int id;
  int *ids;
  Range r;
  int *in_stack_000052b0;
  Generator *in_stack_000052b8;
  Range in_stack_000052d0;
  undefined8 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  
  r_00._4_8_ = in_stack_ffffffffffffffb4;
  r_00.scale = 1;
  r_00.sx = in_stack_ffffffffffffffbc;
  r_00._16_8_ = in_stack_ffffffffffffffc0;
  r_00.sy = in_ESI;
  __ptr = allocCache((Generator *)CONCAT44(in_EDX,in_ESI),r_00);
  iVar1 = genBiomes(in_stack_000052b8,in_stack_000052b0,in_stack_000052d0);
  if (iVar1 == 0) {
    iVar1 = *__ptr;
  }
  else {
    iVar1 = -1;
  }
  free(__ptr);
  return iVar1;
}

Assistant:

int getBiomeAt(const Generator *g, int scale, int x, int y, int z)
{
    Range r = {scale, x, z, 1, 1, y, 1};
    int *ids = allocCache(g, r);
    int id = genBiomes(g, ids, r);
    if (id == 0)
        id = ids[0];
    else
        id = none;
    free(ids);
    return id;
}